

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O0

void ncnn::binary_op_vector<ncnn::BinaryOp_x86_avx_functor::binary_op_add>
               (float *ptr,float *ptr1,float *outptr,int aw,int bw,int ap,int bp)

{
  int in_ECX;
  int in_R8D;
  int in_R9D;
  int size;
  int elempack;
  int w;
  int in_stack_0000007c;
  int in_stack_00000080;
  int in_stack_00000084;
  float *in_stack_00000088;
  float *in_stack_00000090;
  float *in_stack_00000098;
  int in_stack_000000b8;
  int in_stack_000000bc;
  float *in_stack_000000c0;
  float *in_stack_000000c8;
  float *in_stack_000000d0;
  int in_stack_00000108;
  int in_stack_0000010c;
  float *in_stack_00000110;
  float *in_stack_00000118;
  int in_stack_00000120;
  int in_stack_00000124;
  float *in_stack_00000128;
  float *in_stack_00000130;
  float *in_stack_00000138;
  int local_24;
  int local_20;
  int local_1c [7];
  
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c[0] = in_ECX;
  std::max<int>(local_1c,&local_20);
  std::max<int>(&local_24,&size);
  if (local_24 == size) {
    if (local_1c[0] == local_20) {
      binary_op_vector_no_broadcast<ncnn::BinaryOp_x86_avx_functor::binary_op_add>
                (in_stack_00000090,in_stack_00000088,
                 (float *)CONCAT44(in_stack_00000084,in_stack_00000080),in_stack_0000007c);
      return;
    }
    if (local_20 == 1) {
      binary_op_vector_broadcast_b<ncnn::BinaryOp_x86_avx_functor::binary_op_add>
                (in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000bc,
                 in_stack_000000b8);
      return;
    }
    if (local_1c[0] == 1) {
      binary_op_vector_broadcast_a<ncnn::BinaryOp_x86_avx_functor::binary_op_add>
                (in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000bc,
                 in_stack_000000b8);
      return;
    }
  }
  if (size == 1) {
    if (local_1c[0] == local_20) {
      binary_op_vector_broadcast_pb<ncnn::BinaryOp_x86_avx_functor::binary_op_add>
                (in_stack_00000138,in_stack_00000130,in_stack_00000128,in_stack_00000124,
                 in_stack_00000120);
    }
    else if (local_20 == 1) {
      binary_op_vector_broadcast_pb_b<ncnn::BinaryOp_x86_avx_functor::binary_op_add>
                (in_stack_00000098,in_stack_00000090,in_stack_00000088,in_stack_00000084,
                 in_stack_00000080);
    }
    else if (local_1c[0] == 1) {
      binary_op_vector_broadcast_pb_a<ncnn::BinaryOp_x86_avx_functor::binary_op_add>
                ((float *)CONCAT44(in_stack_00000124,in_stack_00000120),in_stack_00000118,
                 in_stack_00000110,in_stack_0000010c,in_stack_00000108);
    }
  }
  return;
}

Assistant:

static void binary_op_vector(const float* ptr, const float* ptr1, float* outptr, int aw, int bw, int ap, int bp)
{
    const int w = std::max(aw, bw);
    const int elempack = std::max(ap, bp);
    const int size = w * elempack;

    if (ap == bp)
    {
        if (aw == bw)
        {
            // no broadcast
            return binary_op_vector_no_broadcast<Op>(ptr, ptr1, outptr, size);
        }

        if (bw == 1)
        {
            // broadcast single b
            return binary_op_vector_broadcast_b<Op>(ptr, ptr1, outptr, size, elempack);
        }

        if (aw == 1)
        {
            // broadcast single a
            return binary_op_vector_broadcast_a<Op>(ptr, ptr1, outptr, size, elempack);
        }
    }

    if (bp == 1)
    {
        if (aw == bw)
        {
            // broadcast pack1 b
            return binary_op_vector_broadcast_pb<Op>(ptr, ptr1, outptr, w, elempack);
        }

        if (bw == 1)
        {
            // broadcast pack1 single b
            return binary_op_vector_broadcast_pb_b<Op>(ptr, ptr1, outptr, w, elempack);
        }

        if (aw == 1)
        {
            // broadcast single a and pack1 b
            return binary_op_vector_broadcast_pb_a<Op>(ptr, ptr1, outptr, w, elempack);
        }
    }

    // shall never reach here
}